

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void __thiscall FLispString::Add(FLispString *this,char *str,size_t len)

{
  CheckWrap(this,this->NeedSpace + len);
  if (this->NeedSpace == true) {
    FString::operator+=(&this->Str,' ');
  }
  FString::AppendCStrPart(&this->Str,str,len);
  this->Column = this->Column + this->NeedSpace + len;
  this->NeedSpace = true;
  return;
}

Assistant:

void Add(const char *str, size_t len)
	{
		CheckWrap(len + NeedSpace);
		if (NeedSpace)
		{
			Str << ' ';
		}
		Str.AppendCStrPart(str, len);
		Column += len + NeedSpace;
		NeedSpace = true;
	}